

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O2

int tcv_get_diagnostic_type(tcv_t *tcv,tcv_diagnostic_type_t *diag_type)

{
  _Bool _Var1;
  int iVar2;
  
  _Var1 = tcv_check_and_lock_ok(tcv);
  if (diag_type == (tcv_diagnostic_type_t *)0x0 || !_Var1) {
    iVar2 = -4;
  }
  else {
    iVar2 = -0xd;
    if (((tcv != (tcv_t *)0x0) && (tcv->created == true)) && (tcv->initialized == true)) {
      iVar2 = (*tcv->fun->get_diagnostic_type)(tcv,diag_type);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&tcv->lock);
  }
  return iVar2;
}

Assistant:

int tcv_get_diagnostic_type(tcv_t *tcv, tcv_diagnostic_type_t *diag_type)
{
	int ret = TCV_ERR_NOT_INITIALIZED;

	if (!tcv_check_and_lock_ok(tcv) || !diag_type)
		return TCV_ERR_INVALID_ARG;

	if (tcv_is_initialized(tcv)) {
		ret = tcv->fun->get_diagnostic_type(tcv, diag_type);
	}
	tcv_unlock(tcv);
	return ret;
}